

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlAutomataStatePtr
xmlAutomataNewCountTrans2
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,xmlChar *token,
          xmlChar *token2,int min,int max,void *data)

{
  int iVar1;
  int iVar2;
  xmlRegAtomPtr atom_00;
  xmlChar *pxVar3;
  size_t sVar4;
  void *__dest;
  xmlChar *str;
  int lenp;
  int lenn;
  int counter;
  xmlRegAtomPtr atom;
  int min_local;
  xmlChar *token2_local;
  xmlChar *token_local;
  xmlAutomataStatePtr to_local;
  xmlAutomataStatePtr from_local;
  xmlAutomataPtr am_local;
  
  if (((am == (xmlAutomataPtr)0x0) || (from == (xmlAutomataStatePtr)0x0)) ||
     (token == (xmlChar *)0x0)) {
    am_local = (xmlAutomataPtr)0x0;
  }
  else if (min < 0) {
    am_local = (xmlAutomataPtr)0x0;
  }
  else if ((max < min) || (max < 1)) {
    am_local = (xmlAutomataPtr)0x0;
  }
  else {
    atom_00 = xmlRegNewAtom(am,XML_REGEXP_STRING);
    if (atom_00 == (xmlRegAtomPtr)0x0) {
      am_local = (xmlAutomataPtr)0x0;
    }
    else {
      if ((token2 == (xmlChar *)0x0) || (*token2 == '\0')) {
        pxVar3 = xmlStrdup(token);
        atom_00->valuep = pxVar3;
      }
      else {
        sVar4 = strlen((char *)token2);
        iVar2 = (int)sVar4;
        sVar4 = strlen((char *)token);
        iVar1 = (int)sVar4;
        __dest = (*xmlMallocAtomic)((long)(iVar2 + iVar1 + 2));
        if (__dest == (void *)0x0) {
          xmlRegFreeAtom(atom_00);
          return (xmlAutomataStatePtr)0x0;
        }
        memcpy(__dest,token,(long)iVar1);
        *(undefined1 *)((long)__dest + (long)iVar1) = 0x7c;
        memcpy((void *)((long)__dest + (long)(iVar1 + 1)),token2,(long)iVar2);
        *(undefined1 *)((long)__dest + (long)(iVar2 + iVar1 + 1)) = 0;
        atom_00->valuep = __dest;
      }
      atom_00->data = data;
      if (min == 0) {
        atom_00->min = 1;
      }
      else {
        atom_00->min = min;
      }
      atom_00->max = max;
      iVar2 = xmlRegGetCounter(am);
      am->counters[iVar2].min = min;
      am->counters[iVar2].max = max;
      token_local = (xmlChar *)to;
      if (to == (xmlAutomataStatePtr)0x0) {
        token_local = (xmlChar *)xmlRegNewState(am);
        xmlRegStatePush(am,(xmlRegStatePtr)token_local);
      }
      xmlRegStateAddTrans(am,from,atom_00,(xmlRegStatePtr)token_local,iVar2,-1);
      xmlRegAtomPush(am,atom_00);
      am->state = (xmlRegStatePtr)token_local;
      if (token_local == (xmlChar *)0x0) {
        token_local = (xmlChar *)am->state;
      }
      if (token_local == (xmlChar *)0x0) {
        am_local = (xmlAutomataPtr)0x0;
      }
      else {
        if (min == 0) {
          xmlFAGenerateEpsilonTransition(am,from,(xmlRegStatePtr)token_local);
        }
        am_local = (xmlAutomataPtr)token_local;
      }
    }
  }
  return (xmlAutomataStatePtr)am_local;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewCountTrans2(xmlAutomataPtr am, xmlAutomataStatePtr from,
			 xmlAutomataStatePtr to, const xmlChar *token,
			 const xmlChar *token2,
			 int min, int max, void *data) {
    xmlRegAtomPtr atom;
    int counter;

    if ((am == NULL) || (from == NULL) || (token == NULL))
	return(NULL);
    if (min < 0)
	return(NULL);
    if ((max < min) || (max < 1))
	return(NULL);
    atom = xmlRegNewAtom(am, XML_REGEXP_STRING);
    if (atom == NULL)
	return(NULL);
    if ((token2 == NULL) || (*token2 == 0)) {
	atom->valuep = xmlStrdup(token);
    } else {
	int lenn, lenp;
	xmlChar *str;

	lenn = strlen((char *) token2);
	lenp = strlen((char *) token);

	str = (xmlChar *) xmlMallocAtomic(lenn + lenp + 2);
	if (str == NULL) {
	    xmlRegFreeAtom(atom);
	    return(NULL);
	}
	memcpy(&str[0], token, lenp);
	str[lenp] = '|';
	memcpy(&str[lenp + 1], token2, lenn);
	str[lenn + lenp + 1] = 0;

	atom->valuep = str;
    }
    atom->data = data;
    if (min == 0)
	atom->min = 1;
    else
	atom->min = min;
    atom->max = max;

    /*
     * associate a counter to the transition.
     */
    counter = xmlRegGetCounter(am);
    am->counters[counter].min = min;
    am->counters[counter].max = max;

    /* xmlFAGenerateTransitions(am, from, to, atom); */
    if (to == NULL) {
        to = xmlRegNewState(am);
	xmlRegStatePush(am, to);
    }
    xmlRegStateAddTrans(am, from, atom, to, counter, -1);
    xmlRegAtomPush(am, atom);
    am->state = to;

    if (to == NULL)
	to = am->state;
    if (to == NULL)
	return(NULL);
    if (min == 0)
	xmlFAGenerateEpsilonTransition(am, from, to);
    return(to);
}